

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

double HTS_white_noise(HTS_Vocoder *v)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  if (v->gauss == '\0') {
    uVar1 = v->x;
    bVar5 = (uVar1 & 2) == 0;
    uVar2 = (uVar1 >> 1) + 0x80000000;
    if (bVar5 == ((uVar1 >> 0x1d & 1) == 0)) {
      uVar2 = uVar1 >> 1;
    }
    v->x = uVar2;
    dVar6 = (double)(int)(-(uint)bVar5 | 1);
  }
  else if (v->sw == '\0') {
    v->sw = '\x01';
    uVar3 = v->next;
    do {
      do {
        lVar4 = uVar3 * 0x41c64e6d + 0x3039;
        uVar3 = lVar4 * 0x41c64e6d + 0x3039;
        auVar9._0_4_ = (undefined4)((ulong)lVar4 >> 0x10);
        auVar9._8_4_ = (undefined4)(uVar3 >> 0x10);
        auVar9._4_4_ = auVar9._8_4_;
        auVar9._12_2_ = (short)(uVar3 >> 0x30);
        auVar9._14_2_ = 0;
        auVar8._0_8_ = (double)SUB164(auVar9 & _DAT_0010eb20,0);
        auVar8._8_8_ = (double)SUB164(auVar9 & _DAT_0010eb20,4);
        auVar9 = divpd(auVar8,_DAT_0010eb30);
        dVar7 = auVar9._0_8_ + auVar9._0_8_ + -1.0;
        dVar10 = auVar9._8_8_ + auVar9._8_8_ + -1.0;
        dVar6 = dVar7 * dVar7 + dVar10 * dVar10;
      } while (1.0 < dVar6);
    } while ((dVar6 == 0.0) && (!NAN(dVar6)));
    v->next = uVar3;
    v->r1 = dVar7;
    v->r2 = dVar10;
    v->s = dVar6;
    dVar6 = log(dVar6);
    dVar6 = (dVar6 * -2.0) / v->s;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    v->s = dVar6;
    dVar6 = dVar6 * v->r1;
  }
  else {
    v->sw = '\0';
    dVar6 = v->r2 * v->s;
  }
  return dVar6;
}

Assistant:

static double HTS_white_noise(HTS_Vocoder * v)
{
   if (v->gauss)
      return (double) HTS_nrandom(v);
   else
      return (double) HTS_mseq(v);
}